

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nn_pipebase_getopt(nn_pipebase *self,int level,int option,void *optval,size_t *optvallen)

{
  FILE *pFVar1;
  char *pcVar2;
  size_t local_50;
  int local_30;
  int local_2c;
  int intval;
  int rc;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_pipebase *self_local;
  
  _intval = optvallen;
  optvallen_local = (size_t *)optval;
  optval_local._0_4_ = option;
  optval_local._4_4_ = level;
  _option_local = self;
  if (level == 0) {
    if (option == 8) {
      local_30 = (self->options).sndprio;
    }
    else if (option == 9) {
      local_30 = (self->options).rcvprio;
    }
    else {
      if (option != 0xe) {
        local_2c = nn_sock_getopt_inner(self->sock,0,option,optval,optvallen);
        if (local_2c == 0) {
          return;
        }
        nn_backtrace_print();
        pFVar1 = _stderr;
        pcVar2 = nn_err_strerror(-local_2c);
        fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-local_2c,
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/pipe.c"
                ,0x93);
        fflush(_stderr);
        nn_err_abort();
      }
      local_30 = (self->options).ipv4only;
    }
    if (*optvallen < 4) {
      local_50 = *optvallen;
    }
    else {
      local_50 = 4;
    }
    memcpy(optval,&local_30,local_50);
    *_intval = 4;
  }
  else {
    local_2c = nn_sock_getopt_inner(self->sock,level,option,optval,optvallen);
    if (local_2c != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      pcVar2 = nn_err_strerror(-local_2c);
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-local_2c,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/pipe.c",
              0x9f);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_pipebase_getopt (struct nn_pipebase *self, int level, int option,
    void *optval, size_t *optvallen)
{
    int rc;
    int intval;

    if (level == NN_SOL_SOCKET) {
        switch (option) {

        /*  Endpoint options  */
        case NN_SNDPRIO:
            intval = self->options.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->options.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->options.ipv4only;
            break;

        /*  Fallback to socket options  */
        default:
            rc = nn_sock_getopt_inner (self->sock, level,
                option, optval, optvallen);
            errnum_assert (rc == 0, -rc);
            return;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return;
    }

    rc = nn_sock_getopt_inner (self->sock, level, option, optval, optvallen);
    errnum_assert (rc == 0, -rc);
}